

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O0

void QApplicationPrivate::setFocusWidget(QWidget *focus,FocusReason reason)

{
  QWidget *pQVar1;
  bool bVar2;
  QGraphicsProxyWidget *pQVar3;
  QObject *pQVar4;
  FocusReason in_ESI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QWidget *prev;
  QPointer<QWidget> that_1;
  QPointer<QWidget> that;
  QFocusEvent in;
  QFocusEvent out;
  QWidget *in_stack_ffffffffffffff88;
  QWidget *_t2;
  undefined4 in_stack_ffffffffffffff98;
  QWidgetPrivate *in_stack_ffffffffffffffb0;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined8 in_stack_fffffffffffffff0;
  QWidget *this;
  
  this = *(QWidget **)(in_FS_OFFSET + 0x28);
  if (in_RDI != (QWidget *)0x0) {
    QWidget::window(in_RDI);
    pQVar3 = QWidget::graphicsProxyWidget(in_stack_ffffffffffffff88);
    pQVar1 = hidden_focus_widget;
    if (pQVar3 != (QGraphicsProxyWidget *)0x0) goto LAB_002cc975;
  }
  hidden_focus_widget = (QWidget *)0x0;
  pQVar1 = hidden_focus_widget;
  if ((in_RDI != focus_widget) &&
     ((in_RDI == (QWidget *)0x0 ||
      (bVar2 = QWidget::isHidden((QWidget *)0x2cc6f9), pQVar1 = in_RDI, !bVar2)))) {
    if ((in_RDI == (QWidget *)0x0) ||
       (((in_ESI != BacktabFocusReason && (in_ESI != TabFocusReason)) ||
        ((qt_in_tab_key_event & 1U) == 0)))) {
      if ((in_RDI != (QWidget *)0x0) && (in_ESI == ShortcutFocusReason)) {
        QWidget::window(in_RDI);
        QWidget::setAttribute
                  (this,(WidgetAttribute)((ulong)in_stack_fffffffffffffff0 >> 0x20),
                   SUB81((ulong)in_stack_fffffffffffffff0 >> 0x18,0));
      }
    }
    else {
      QWidget::window(in_RDI);
      QWidget::setAttribute
                (this,(WidgetAttribute)((ulong)in_stack_fffffffffffffff0 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffffff0 >> 0x18,0));
    }
    pQVar1 = in_RDI;
    _t2 = focus_widget;
    if (in_RDI != (QWidget *)0x0) {
      QWidget::d_func((QWidget *)0x2cc7b7);
      focus_widget = pQVar1;
      QWidgetPrivate::setFocus_sys(in_stack_ffffffffffffffb0);
      pQVar1 = focus_widget;
    }
    focus_widget = pQVar1;
    pQVar1 = hidden_focus_widget;
    if (in_ESI != NoFocusReason) {
      if (_t2 != (QWidget *)0x0) {
        local_20 = &DAT_aaaaaaaaaaaaaaaa;
        local_18 = &DAT_aaaaaaaaaaaaaaaa;
        QFocusEvent::QFocusEvent((QFocusEvent *)&local_20,FocusOut,in_ESI);
        QPointer<QWidget>::QPointer<void>((QPointer<QWidget> *)_t2,in_stack_ffffffffffffff88);
        QCoreApplication::sendEvent(&_t2->super_QObject,(QEvent *)&local_20);
        bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x2cc84d);
        if (bVar2) {
          QPointer<QWidget>::operator->((QPointer<QWidget> *)0x2cc85d);
          pQVar4 = &QWidget::style(in_stack_ffffffffffffff88)->super_QObject;
          QCoreApplication::sendEvent(pQVar4,(QEvent *)&local_20);
        }
        QPointer<QWidget>::~QPointer((QPointer<QWidget> *)0x2cc87c);
        QFocusEvent::~QFocusEvent((QFocusEvent *)&local_20);
      }
      if ((in_RDI != (QWidget *)0x0) && (focus_widget == in_RDI)) {
        local_38 = &DAT_aaaaaaaaaaaaaaaa;
        local_30 = &DAT_aaaaaaaaaaaaaaaa;
        local_28 = &DAT_aaaaaaaaaaaaaaaa;
        QFocusEvent::QFocusEvent((QFocusEvent *)&local_38,FocusIn,in_ESI);
        QPointer<QWidget>::QPointer<void>((QPointer<QWidget> *)_t2,in_stack_ffffffffffffff88);
        QCoreApplication::sendEvent(&in_RDI->super_QObject,(QEvent *)&local_38);
        bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x2cc91e);
        if (bVar2) {
          QPointer<QWidget>::operator->((QPointer<QWidget> *)0x2cc92e);
          pQVar4 = &QWidget::style(in_stack_ffffffffffffff88)->super_QObject;
          QCoreApplication::sendEvent(pQVar4,(QEvent *)&local_38);
        }
        QPointer<QWidget>::~QPointer((QPointer<QWidget> *)0x2cc94d);
        QFocusEvent::~QFocusEvent((QFocusEvent *)&local_38);
      }
      QCoreApplication::instance();
      QApplication::focusChanged
                ((QApplication *)in_stack_ffffffffffffff88,
                 (QWidget *)CONCAT44(in_ESI,in_stack_ffffffffffffff98),_t2);
      pQVar1 = hidden_focus_widget;
    }
  }
LAB_002cc975:
  hidden_focus_widget = pQVar1;
  if (*(QWidget **)(in_FS_OFFSET + 0x28) != this) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QApplicationPrivate::setFocusWidget(QWidget *focus, Qt::FocusReason reason)
{
#if QT_CONFIG(graphicsview)
    if (focus && focus->window()->graphicsProxyWidget())
        return;
#endif

    hidden_focus_widget = nullptr;

    if (focus != focus_widget) {
        if (focus && focus->isHidden()) {
            hidden_focus_widget = focus;
            return;
        }

        if (focus && (reason == Qt::BacktabFocusReason || reason == Qt::TabFocusReason)
            && qt_in_tab_key_event)
            focus->window()->setAttribute(Qt::WA_KeyboardFocusChange);
        else if (focus && reason == Qt::ShortcutFocusReason) {
            focus->window()->setAttribute(Qt::WA_KeyboardFocusChange);
        }
        QWidget *prev = focus_widget;
        focus_widget = focus;

        if (focus_widget)
            focus_widget->d_func()->setFocus_sys();

        if (reason != Qt::NoFocusReason) {

            //send events
            if (prev) {
#ifdef QT_KEYPAD_NAVIGATION
                if (QApplicationPrivate::keyboardNavigationEnabled()) {
                    if (prev->hasEditFocus() && reason != Qt::PopupFocusReason)
                        prev->setEditFocus(false);
                }
#endif
                QFocusEvent out(QEvent::FocusOut, reason);
                QPointer<QWidget> that = prev;
                QCoreApplication::sendEvent(prev, &out);
                if (that)
                    QCoreApplication::sendEvent(that->style(), &out);
            }
            if (focus && QApplicationPrivate::focus_widget == focus) {
                QFocusEvent in(QEvent::FocusIn, reason);
                QPointer<QWidget> that = focus;
                QCoreApplication::sendEvent(focus, &in);
                if (that)
                    QCoreApplication::sendEvent(that->style(), &in);
            }
            emit qApp->focusChanged(prev, focus_widget);
        }
    }
}